

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_socket.cpp
# Opt level: O2

ssize_t __thiscall net::TcpSocket::read_n(TcpSocket *this,void *msg,size_t buf_len)

{
  ssize_t sVar1;
  size_t sVar2;
  
  if (msg == (void *)0x0) {
    __assert_fail("msg != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/distanceNing[P]benchmarkTool/socket/tcp_socket.cpp"
                  ,0x74,"ssize_t net::TcpSocket::read_n(void *, size_t)");
  }
  sVar2 = 0;
  do {
    sVar1 = read(this->fd_,(void *)((long)msg + sVar2),buf_len - sVar2);
    if (sVar1 < 1) {
      return sVar2;
    }
    sVar2 = sVar2 + sVar1;
  } while (sVar2 != buf_len);
  return buf_len;
}

Assistant:

ssize_t TcpSocket::read_n(void* msg, size_t buf_len)
{
    assert(msg != NULL);
    ssize_t recv_size = 0;
    ssize_t a_recv_size;
    while ((a_recv_size = ::read(fd_, (char*) msg + recv_size, buf_len - recv_size)) > 0) {
        recv_size += a_recv_size;
        if ( recv_size == buf_len )
            break;
    }
    return recv_size;
}